

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetValue<false,Js::PolymorphicInlineCache>
              (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext_00;
  undefined4 *puVar4;
  ThreadContext *this;
  PropertyRecord *this_00;
  char16 *varName;
  JavascriptLibrary *this_01;
  PropertyId propertyId_local;
  Var instance_local;
  InlineCacheIndex inlineCacheIndex_local;
  PolymorphicInlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  Var value;
  PropertyValueInfo info;
  RecyclableObject *object;
  ScriptContext *scriptContext;
  FunctionBody *local_10;
  
  scriptContext_00 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar2 = JavascriptStackWalker::ValidateTopJitFrame(scriptContext_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1f02,
                                "(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext))",
                                "Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  BVar3 = GetPropertyObject(instance,scriptContext_00,(RecyclableObject **)&info.inlineCacheIndex);
  if (BVar3 == 0) {
    this = ScriptContext::GetThreadContext(scriptContext_00);
    bVar2 = ThreadContext::RecordImplicitException(this);
    if (bVar2) {
      this_00 = ScriptContext::GetPropertyName(scriptContext_00,propertyId);
      varName = PropertyRecord::GetBuffer(this_00);
      JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ec48,varName);
    }
    this_01 = ScriptContext::GetLibrary(scriptContext_00);
    local_10 = (FunctionBody *)
               JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  }
  else {
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)&value,functionBody,inlineCache,inlineCacheIndex,true);
    bVar2 = CacheOperators::TryGetProperty<true,true,true,true,true,true,false,true,false,false>
                      (instance,false,(RecyclableObject *)info._56_8_,propertyId,&functionBody_local
                       ,scriptContext_00,(PropertyCacheOperationInfo *)0x0,
                       (PropertyValueInfo *)&value);
    if (bVar2) {
      local_10 = functionBody_local;
    }
    else {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
      if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
        CacheOperators::TraceCache
                  (inlineCache,L"PatchGetValue",propertyId,scriptContext_00,
                   (RecyclableObject *)info._56_8_);
      }
      local_10 = (FunctionBody *)
                 GetProperty(instance,(RecyclableObject *)info._56_8_,propertyId,scriptContext_00,
                             (PropertyValueInfo *)&value);
    }
  }
  return local_10;
}

Assistant:

inline Var JavascriptOperators::PatchGetValue(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetValue);
        return PatchGetValueWithThisPtr<IsFromFullJit, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, instance, propertyId, instance);
        JIT_HELPER_END(Op_PatchGetValue);
    }